

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

double get_energy_by_q2_thresh(GF_GROUP *gf_group,RATE_CONTROL *rc,int gf_frame_index)

{
  int gf_frame_index_local;
  RATE_CONTROL *rc_local;
  GF_GROUP *gf_group_local;
  double local_8;
  
  if (gf_group->update_type[gf_frame_index] == '\x03') {
    local_8 = 0.008;
  }
  else if (gf_group->update_type[gf_frame_index] == '\0') {
    if (rc->frames_to_key < 2) {
      local_8 = 0.012;
    }
    else {
      local_8 = 0.008;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

static double get_energy_by_q2_thresh(const GF_GROUP *gf_group,
                                      const RATE_CONTROL *rc,
                                      int gf_frame_index) {
  // TODO(now): Return keyframe thresh * factor based on frame type / pyramid
  // level.
  if (gf_group->update_type[gf_frame_index] == ARF_UPDATE) {
    return SUPERRES_ENERGY_BY_Q2_THRESH_ARFFRAME;
  } else if (gf_group->update_type[gf_frame_index] == KF_UPDATE) {
    if (rc->frames_to_key <= 1)
      return SUPERRES_ENERGY_BY_Q2_THRESH_KEYFRAME_SOLO;
    else
      return SUPERRES_ENERGY_BY_Q2_THRESH_KEYFRAME;
  } else {
    assert(0);
  }
  return 0;
}